

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatSolverAPI.c
# Opt level: O2

void xSAT_SolverDestroy(xSAT_Solver_t *s)

{
  xSAT_Mem_t *__ptr;
  xSAT_Heap_t *__ptr_00;
  
  __ptr = s->pMemory;
  free(__ptr->pData);
  free(__ptr);
  Vec_IntFree(s->vClauses);
  Vec_IntFree(s->vLearnts);
  xSAT_VecWatchListFree(s->vWatches);
  xSAT_VecWatchListFree(s->vBinWatches);
  __ptr_00 = s->hOrder;
  Vec_IntFree(__ptr_00->vIndices);
  Vec_IntFree(__ptr_00->vHeap);
  free(__ptr_00);
  Vec_IntFree(s->vTrailLim);
  Vec_IntFree(s->vTrail);
  Vec_IntFree(s->vTagged);
  Vec_IntFree(s->vStack);
  Vec_StrFree(s->vSeen);
  Vec_IntFree(s->vLearntClause);
  Vec_IntFree(s->vLastDLevel);
  Vec_IntFree(s->vActivity);
  Vec_StrFree(s->vPolarity);
  Vec_StrFree(s->vTags);
  Vec_StrFree(s->vAssigns);
  Vec_IntFree(s->vLevels);
  Vec_IntFree(s->vReasons);
  Vec_IntFree(s->vStamp);
  xSAT_BQueueFree(s->bqLBD);
  xSAT_BQueueFree(s->bqTrail);
  free(s);
  return;
}

Assistant:

void xSAT_SolverDestroy( xSAT_Solver_t * s )
{
    xSAT_MemFree( s->pMemory );
    Vec_IntFree( s->vClauses );
    Vec_IntFree( s->vLearnts );
    xSAT_VecWatchListFree( s->vWatches );
    xSAT_VecWatchListFree( s->vBinWatches );

    xSAT_HeapFree(s->hOrder);
    Vec_IntFree( s->vTrailLim );
    Vec_IntFree( s->vTrail );
    Vec_IntFree( s->vTagged );
    Vec_IntFree( s->vStack );

    Vec_StrFree( s->vSeen );
    Vec_IntFree( s->vLearntClause );
    Vec_IntFree( s->vLastDLevel );

    Vec_IntFree( s->vActivity );
    Vec_StrFree( s->vPolarity );
    Vec_StrFree( s->vTags );
    Vec_StrFree( s->vAssigns );
    Vec_IntFree( s->vLevels );
    Vec_IntFree( s->vReasons );
    Vec_IntFree( s->vStamp );

    xSAT_BQueueFree(s->bqLBD);
    xSAT_BQueueFree(s->bqTrail);

    ABC_FREE(s);
}